

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O1

void glfwMaximizeWindow(GLFWwindow *handle)

{
  long *plVar1;
  Atom AVar2;
  long lVar3;
  ulong uVar4;
  _GLFWwindow *window;
  ulong uVar5;
  long lStack_118;
  undefined1 auStack_10c [4];
  undefined8 uStack_108;
  undefined8 uStack_100;
  undefined1 auStack_f8 [8];
  long lStack_f0;
  undefined8 uStack_e8;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined8 uStack_c8;
  Atom AStack_c0;
  undefined4 uStack_b8;
  undefined8 uStack_b0;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined8 uStack_98;
  undefined8 uStack_90;
  
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/apitrace[P]apitrace-tests/thirdparty/glfw/src/window.c"
                  ,0x2e8,"void glfwMaximizeWindow(GLFWwindow *)");
  }
  if (_glfw.initialized != 0) {
    if (*(long *)(handle + 0x48) != 0) {
      return;
    }
    if (((_glfw.x11.NET_WM_STATE != 0) &&
        (CONCAT44(_glfw.x11.NET_WM_STATE_MAXIMIZED_VERT._4_4_,
                  (undefined4)_glfw.x11.NET_WM_STATE_MAXIMIZED_VERT) != 0)) &&
       (CONCAT44(_glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ._4_4_,
                 (undefined4)_glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ) != 0)) {
      XGetWindowAttributes(_glfw.x11.display,*(undefined8 *)(handle + 0x350),&uStack_e8);
      AVar2 = _glfw.x11.NET_WM_STATE;
      if (uStack_90._4_4_ == 2) {
        uStack_108 = CONCAT44(_glfw.x11.NET_WM_STATE_MAXIMIZED_VERT._4_4_,
                              (undefined4)_glfw.x11.NET_WM_STATE_MAXIMIZED_VERT);
        uStack_100 = CONCAT44(_glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ._4_4_,
                              (undefined4)_glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ);
        memset(&uStack_e8,0,0xc0);
        uStack_e8._0_4_ = 0x21;
        uStack_c8 = *(undefined8 *)(handle + 0x350);
        uStack_b8 = 0x20;
        AStack_c0 = AVar2;
        uStack_b0 = 1;
        uStack_a8 = (undefined4)uStack_108;
        uStack_a4 = uStack_108._4_4_;
        uStack_a0 = (undefined4)uStack_100;
        uStack_9c = uStack_100._4_4_;
        uStack_98 = 1;
        uStack_90 = 0;
        XSendEvent(_glfw.x11.display,_glfw.x11.root,0,0x180000,&uStack_e8);
      }
      else {
        lStack_118 = 0;
        XGetWindowProperty(_glfw.x11.display,*(undefined8 *)(handle + 0x350),_glfw.x11.NET_WM_STATE,
                           0,0x7fffffffffffffff,0,4,&uStack_e8,auStack_10c,&lStack_f0,auStack_f8,
                           &lStack_118);
        uStack_e8._0_4_ = (undefined4)_glfw.x11.NET_WM_STATE_MAXIMIZED_VERT;
        uStack_e8._4_4_ = _glfw.x11.NET_WM_STATE_MAXIMIZED_VERT._4_4_;
        uStack_e0 = (undefined4)_glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ;
        uStack_dc = _glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ._4_4_;
        uVar5 = 2;
        if (lStack_f0 != 0) {
          lVar3 = 0;
          do {
            if (uVar5 != 0) {
              uVar4 = 0;
              do {
                if (*(long *)(lStack_118 + lVar3 * 8) == (&uStack_e8)[uVar4]) {
                  plVar1 = &lStack_f0 + uVar5;
                  uVar5 = uVar5 - 1;
                  (&uStack_e8)[uVar4] = *plVar1;
                }
                uVar4 = uVar4 + 1;
              } while (uVar4 < uVar5);
            }
            lVar3 = lVar3 + 1;
          } while (lVar3 != lStack_f0);
        }
        if (lStack_118 != 0) {
          XFree();
        }
        if (uVar5 == 0) {
          return;
        }
        XChangeProperty(_glfw.x11.display,*(undefined8 *)(handle + 0x350),_glfw.x11.NET_WM_STATE,4,
                        0x20,2,&uStack_e8,uVar5);
      }
      XFlush(_glfw.x11.display);
    }
    return;
  }
  _glfwInputError(0x10001,(char *)0x0);
  return;
}

Assistant:

GLFWAPI void glfwMaximizeWindow(GLFWwindow* handle)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    if (window->monitor)
        return;

    _glfwPlatformMaximizeWindow(window);
}